

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O3

int attr_counter_inc(attr_counter **top,attr_counter *ac,attr_counter *last,mtree_entry_conflict *me
                    )

{
  int iVar1;
  int iVar2;
  attr_counter *paVar3;
  attr_counter **ppaVar4;
  attr_counter *paVar5;
  attr_counter *paVar6;
  
  if (ac == (attr_counter *)0x0) {
    paVar6 = (attr_counter *)malloc(0x20);
    if (paVar6 == (attr_counter *)0x0) {
      return -1;
    }
    paVar6->prev = last;
    paVar6->next = (attr_counter *)0x0;
    paVar6->count = 1;
    paVar6->m_entry = me;
    last->next = paVar6;
  }
  else {
    iVar1 = ac->count;
    ac->count = iVar1 + 1;
    if (*top == ac) {
      return 0;
    }
    paVar6 = ac->prev;
    paVar5 = paVar6;
    if (iVar1 < paVar6->count) {
      return 0;
    }
    do {
      iVar2 = paVar5->count;
      if (iVar1 < iVar2) goto LAB_00432546;
      ppaVar4 = &paVar5->prev;
      paVar5 = *ppaVar4;
    } while (*ppaVar4 != (attr_counter *)0x0);
    paVar5 = (attr_counter *)0x0;
LAB_00432546:
    paVar3 = ac->next;
    paVar6->next = paVar3;
    if (paVar3 != (attr_counter *)0x0) {
      paVar3->prev = paVar6;
    }
    if (iVar1 < iVar2) {
      ac->prev = paVar5;
      ac->next = paVar5->next;
      paVar5->next = ac;
      if (ac->next == (attr_counter *)0x0) {
        return 0;
      }
      ac->next->prev = ac;
      return 0;
    }
    ac->prev = (attr_counter *)0x0;
    ac->next = *top;
    *top = ac;
    ac->next->prev = ac;
  }
  return 0;
}

Assistant:

static int
attr_counter_inc(struct attr_counter **top, struct attr_counter *ac,
    struct attr_counter *last, struct mtree_entry *me)
{
	struct attr_counter *pac;

	if (ac != NULL) {
		ac->count++;
		if (*top == ac || ac->prev->count >= ac->count)
			return (0);
		for (pac = ac->prev; pac; pac = pac->prev) {
			if (pac->count >= ac->count)
				break;
		}
		ac->prev->next = ac->next;
		if (ac->next != NULL)
			ac->next->prev = ac->prev;
		if (pac != NULL) {
			ac->prev = pac;
			ac->next = pac->next;
			pac->next = ac;
			if (ac->next != NULL)
				ac->next->prev = ac;
		} else {
			ac->prev = NULL;
			ac->next = *top;
			*top = ac;
			ac->next->prev = ac;
		}
	} else {
		ac = attr_counter_new(me, last);
		if (ac == NULL)
			return (-1);
		last->next = ac;
	}
	return (0);
}